

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

time util::to_local_time(time t)

{
  time_t tVar1;
  tm datetime;
  time local_48;
  tm local_40;
  
  local_48 = t;
  gmtime_r(&local_48,&local_40);
  local_40.tm_isdst = 0;
  tVar1 = mktime(&local_40);
  return tVar1;
}

Assistant:

time to_local_time(time t) {
	
	// Format time as UTC ...
	std::tm datetime = format_time(t);
	
	// ... and interpret it as local time
	datetime.tm_isdst = 0;
	#if defined(_WIN32)
	return _mktime64(&datetime);
	#else
	return std::mktime(&datetime);
	#endif
}